

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdecompresshelper.cpp
# Opt level: O1

qsizetype __thiscall
QDecompressHelper::readBrotli(QDecompressHelper *this,char *data,qsizetype maxSize)

{
  size_t *psVar1;
  void *pvVar2;
  QByteArray *pQVar3;
  QArrayData *pQVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  bool bVar7;
  int iVar8;
  undefined4 uVar9;
  uint8_t *puVar10;
  char *pcVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  size_t unaff_R13;
  size_t sVar16;
  size_t sVar17;
  long in_FS_OFFSET;
  QAnyStringView QVar18;
  size_t unusedDecodedSize;
  uint8_t *decodedPtr;
  size_t encodedBytesRemaining;
  uint8_t *encodedPtr;
  QArrayData *local_90 [3];
  QArrayData *local_78;
  char16_t *pcStack_70;
  qsizetype local_68;
  long local_58;
  char *local_50;
  long local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar2 = this->decoderPointer;
  sVar16 = 0;
  if ((0 < maxSize) && (this->decoderHasData != false)) {
    sVar16 = 0;
    do {
      if (this->brotliUnconsumedDataPtr != (uint8_t *)0x0) {
        unaff_R13 = maxSize - sVar16;
        if (this->brotliUnconsumedAmount < maxSize - sVar16) {
          unaff_R13 = this->brotliUnconsumedAmount;
        }
        memcpy(data + sVar16,this->brotliUnconsumedDataPtr,unaff_R13);
        this->brotliUnconsumedDataPtr = this->brotliUnconsumedDataPtr + unaff_R13;
        sVar16 = sVar16 + unaff_R13;
        psVar1 = &this->brotliUnconsumedAmount;
        *psVar1 = *psVar1 - unaff_R13;
        if (*psVar1 == 0) {
          this->brotliUnconsumedDataPtr = (uint8_t *)0x0;
          this->decoderHasData = false;
        }
      }
      iVar8 = BrotliDecoderHasMoreOutput(pvVar2);
      if (iVar8 == 1) {
        puVar10 = (uint8_t *)BrotliDecoderTakeOutput(pvVar2,&this->brotliUnconsumedAmount);
        this->brotliUnconsumedDataPtr = puVar10;
        this->decoderHasData = true;
      }
    } while ((this->decoderHasData == true) && ((long)sVar16 < maxSize));
  }
  sVar17 = sVar16;
  if (maxSize - sVar16 != 0) {
    if ((this->compressedDataBuffer).bufferCompleteSize == 0) {
      lVar15 = 0;
      local_40 = (char *)0x0;
    }
    else {
      pQVar3 = (this->compressedDataBuffer).buffers.d.ptr;
      lVar15 = (this->compressedDataBuffer).firstPos;
      local_40 = (pQVar3->d).ptr;
      if (local_40 == (char *)0x0) {
        local_40 = (char *)&QByteArray::_empty;
      }
      local_40 = local_40 + lVar15;
      lVar15 = (pQVar3->d).size - lVar15;
    }
    local_50 = data + sVar16;
    local_58 = maxSize - sVar16;
    local_48 = lVar15;
    do {
      lVar13 = local_58;
      if (local_58 == 0) {
        QByteDataBuffer::advanceReadPointer(&this->compressedDataBuffer,lVar15 - local_48);
        sVar17 = sVar16;
        break;
      }
      uVar9 = BrotliDecoderDecompressStream(pvVar2,&local_48,&local_40,&local_58,&local_50,0);
      sVar16 = (lVar13 - local_58) + sVar16;
      bVar7 = true;
      lVar13 = local_48;
      pcVar11 = local_40;
      switch(uVar9) {
      case 0:
        QCoreApplication::translate((char *)local_90,"QHttp","Brotli error: %1",0);
        uVar9 = BrotliDecoderGetErrorCode(pvVar2);
        lVar12 = BrotliDecoderErrorString(uVar9);
        lVar13 = 0;
        if (lVar12 != 0) {
          lVar14 = -1;
          do {
            lVar13 = lVar14 + 1;
            pcVar11 = (char *)(lVar12 + 1 + lVar14);
            lVar14 = lVar13;
          } while (*pcVar11 != '\0');
        }
        QVar18.m_size = (size_t)local_90;
        QVar18.field_0.m_data = &local_78;
        QString::arg_impl(QVar18,(int)lVar12,(QChar)(char16_t)lVar13);
        pQVar4 = &((this->errorStr).d.d)->super_QArrayData;
        pcVar5 = (this->errorStr).d.ptr;
        (this->errorStr).d.d = (Data *)local_78;
        (this->errorStr).d.ptr = pcStack_70;
        qVar6 = (this->errorStr).d.size;
        (this->errorStr).d.size = local_68;
        local_78 = pQVar4;
        pcStack_70 = pcVar5;
        local_68 = qVar6;
        if (pQVar4 != (QArrayData *)0x0) {
          LOCK();
          (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar4,2,0x10);
          }
        }
        if (local_90[0] != (QArrayData *)0x0) {
          LOCK();
          (local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_90[0],2,0x10);
          }
        }
        unaff_R13 = 0xffffffffffffffff;
        bVar7 = false;
        lVar13 = local_48;
        pcVar11 = local_40;
        break;
      case 1:
        BrotliDecoderDestroyInstance(pvVar2);
        this->decoderPointer = (void *)0x0;
        QList<QByteArray>::clear((QList<QByteArray> *)this);
        (this->compressedDataBuffer).bufferCompleteSize = 0;
        (this->compressedDataBuffer).firstPos = 0;
LAB_001e6c08:
        bVar7 = false;
        unaff_R13 = sVar16;
        lVar13 = local_48;
        pcVar11 = local_40;
        break;
      case 2:
        QByteDataBuffer::advanceReadPointer(&this->compressedDataBuffer,lVar15);
        if ((this->compressedDataBuffer).bufferCompleteSize == 0) {
          lVar15 = 0;
          pcVar11 = (char *)0x0;
        }
        else {
          pQVar3 = (this->compressedDataBuffer).buffers.d.ptr;
          pcVar11 = (pQVar3->d).ptr;
          if (pcVar11 == (char *)0x0) {
            pcVar11 = (char *)&QByteArray::_empty;
          }
          lVar15 = (this->compressedDataBuffer).firstPos;
          pcVar11 = pcVar11 + lVar15;
          lVar15 = (pQVar3->d).size - lVar15;
        }
        lVar13 = lVar15;
        if (lVar15 == 0) goto LAB_001e6c08;
        break;
      case 3:
        iVar8 = BrotliDecoderHasMoreOutput(pvVar2);
        this->decoderHasData = iVar8 != 0;
        lVar13 = local_48;
        pcVar11 = local_40;
      }
      local_40 = pcVar11;
      local_48 = lVar13;
      sVar17 = unaff_R13;
    } while (bVar7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return sVar17;
}

Assistant:

qsizetype QDecompressHelper::readBrotli(char *data, const qsizetype maxSize)
{
#if !QT_CONFIG(brotli)
    Q_UNUSED(data);
    Q_UNUSED(maxSize);
    Q_UNREACHABLE();
#else
    qint64 bytesDecoded = 0;

    BrotliDecoderState *brotliDecoderState = toBrotliPointer(decoderPointer);

    while (decoderHasData && bytesDecoded < maxSize) {
        Q_ASSERT(brotliUnconsumedDataPtr || BrotliDecoderHasMoreOutput(brotliDecoderState));
        if (brotliUnconsumedDataPtr) {
            Q_ASSERT(brotliUnconsumedAmount);
            size_t toRead = std::min(size_t(maxSize - bytesDecoded), brotliUnconsumedAmount);
            memcpy(data + bytesDecoded, brotliUnconsumedDataPtr, toRead);
            bytesDecoded += toRead;
            brotliUnconsumedAmount -= toRead;
            brotliUnconsumedDataPtr += toRead;
            if (brotliUnconsumedAmount == 0) {
                brotliUnconsumedDataPtr = nullptr;
                decoderHasData = false;
            }
        }
        if (BrotliDecoderHasMoreOutput(brotliDecoderState) == BROTLI_TRUE) {
            brotliUnconsumedDataPtr =
                    BrotliDecoderTakeOutput(brotliDecoderState, &brotliUnconsumedAmount);
            decoderHasData = true;
        }
    }
    if (bytesDecoded == maxSize)
        return bytesDecoded;
    Q_ASSERT(bytesDecoded < maxSize);

    QByteArrayView input = compressedDataBuffer.readPointer();
    const uint8_t *encodedPtr = reinterpret_cast<const uint8_t *>(input.data());
    size_t encodedBytesRemaining = input.size();

    uint8_t *decodedPtr = reinterpret_cast<uint8_t *>(data + bytesDecoded);
    size_t unusedDecodedSize = size_t(maxSize - bytesDecoded);
    while (unusedDecodedSize > 0) {
        auto previousUnusedDecodedSize = unusedDecodedSize;
        BrotliDecoderResult result = BrotliDecoderDecompressStream(
                brotliDecoderState, &encodedBytesRemaining, &encodedPtr, &unusedDecodedSize,
                &decodedPtr, nullptr);
        bytesDecoded += previousUnusedDecodedSize - unusedDecodedSize;

        switch (result) {
        Q_UNLIKELY_BRANCH
        case BROTLI_DECODER_RESULT_ERROR:
            //: Brotli (compression algorithm) decoding error, e.g. corrupted input or memory allocation problem.
            errorStr = QCoreApplication::translate("QHttp", "Brotli error: %1")
                           .arg(QUtf8StringView{BrotliDecoderErrorString(
                               BrotliDecoderGetErrorCode(brotliDecoderState))});
            return -1;
        case BROTLI_DECODER_RESULT_SUCCESS:
            BrotliDecoderDestroyInstance(brotliDecoderState);
            decoderPointer = nullptr;
            compressedDataBuffer.clear();
            return bytesDecoded;
        case BROTLI_DECODER_RESULT_NEEDS_MORE_INPUT:
            compressedDataBuffer.advanceReadPointer(input.size());
            input = compressedDataBuffer.readPointer();
            if (!input.isEmpty()) {
                encodedPtr = reinterpret_cast<const uint8_t *>(input.constData());
                encodedBytesRemaining = input.size();
                break;
            }
            return bytesDecoded;
        case BROTLI_DECODER_RESULT_NEEDS_MORE_OUTPUT:
            // Some data is leftover inside the brotli decoder, remember for next time
            decoderHasData = BrotliDecoderHasMoreOutput(brotliDecoderState);
            Q_ASSERT(unusedDecodedSize == 0);
            break;
        }
    }
    compressedDataBuffer.advanceReadPointer(input.size() - encodedBytesRemaining);
    return bytesDecoded;
#endif
}